

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

int google::protobuf::internal::WireFormat::ByteSize(Message *message)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UnknownFieldSet *pUVar4;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  long *plVar3;
  
  iVar1 = (*(message->super_MessageLite)._vptr_MessageLite[0x13])();
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x12])(message);
  plVar3 = (long *)CONCAT44(extraout_var_00,iVar2);
  (**(code **)(*plVar3 + 0x60))(plVar3,message);
  if (*(char *)(*(long *)(CONCAT44(extraout_var,iVar1) + 0x20) + 0x58) == '\0') {
    pUVar4 = (UnknownFieldSet *)(**(code **)(*plVar3 + 0x10))(plVar3,message);
    iVar1 = ComputeUnknownFieldsSize(pUVar4);
  }
  else {
    pUVar4 = (UnknownFieldSet *)(**(code **)(*plVar3 + 0x10))(plVar3,message);
    iVar1 = ComputeUnknownMessageSetItemsSize(pUVar4);
  }
  return iVar1;
}

Assistant:

int WireFormat::ByteSize(const Message& message) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* message_reflection = message.GetReflection();

  int our_size = 0;

  vector<const FieldDescriptor*> fields;
  message_reflection->ListFields(message, &fields);
  for (int i = 0; i < fields.size(); i++) {
    our_size += FieldByteSize(fields[i], message);
  }

  if (descriptor->options().message_set_wire_format()) {
    our_size += ComputeUnknownMessageSetItemsSize(
      message_reflection->GetUnknownFields(message));
  } else {
    our_size += ComputeUnknownFieldsSize(
      message_reflection->GetUnknownFields(message));
  }

  return our_size;
}